

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O0

void __thiscall polyscope::Structure::setTransformUniforms(Structure *this,ShaderProgram *p)

{
  float _x;
  long *plVar1;
  bool bVar2;
  byte bVar3;
  float *pfVar4;
  element_type *peVar5;
  reference ppSVar6;
  long *in_RSI;
  long in_RDI;
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar10 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar11 [64];
  vec4 vVar13;
  mat4 Vinv;
  mat4 V;
  mat4 Pinv;
  mat4 P;
  vec4 viewport_1;
  bool ignoreThisPlane;
  SlicePlane *s;
  iterator __end1;
  iterator __begin1;
  vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_> *__range1;
  vec2 viewportDim;
  vec4 viewport;
  mat4 projMat;
  mat4 viewMat;
  vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>
  *in_stack_fffffffffffff9e8;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffff9f0;
  mat<4,_4,_float,_(glm::qualifier)0> *m;
  string *in_stack_fffffffffffffa18;
  allocator *paVar14;
  Structure *in_stack_fffffffffffffa20;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  byte local_529;
  long *in_stack_fffffffffffffb00;
  ShaderProgram *in_stack_fffffffffffffb08;
  SlicePlane *in_stack_fffffffffffffb10;
  allocator local_481;
  string local_480 [100];
  mat<4,_4,_float,_(glm::qualifier)0> local_41c;
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [167];
  allocator local_309;
  string local_308 [32];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  allocator local_2c9;
  string local_2c8 [36];
  undefined8 local_2a4;
  undefined8 uStack_29c;
  allocator local_291;
  string local_290 [32];
  string local_270 [39];
  undefined1 local_249;
  SlicePlane *local_248;
  SlicePlane **local_240;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  local_238;
  undefined1 *local_230;
  allocator local_221;
  string local_220 [37];
  byte local_1fb;
  byte local_1fa;
  allocator local_1f9;
  string local_1f8 [37];
  byte local_1d3;
  byte local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  vec<2,_float,_(glm::qualifier)0> local_1b0;
  allocator local_1a1;
  string local_1a0 [36];
  vec<2,_float,_(glm::qualifier)0> local_17c;
  vec<4,_float,_(glm::qualifier)0> local_174;
  undefined1 local_161 [40];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [119];
  allocator local_71;
  string local_70 [96];
  long *local_10;
  undefined1 auVar9 [56];
  undefined1 auVar12 [56];
  
  local_10 = in_RSI;
  getModelView((Structure *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"u_modelView",&local_71);
  pfVar4 = glm::value_ptr<float,(glm::qualifier)0>((mat<4,_4,_float,_(glm::qualifier)0> *)0x349b74);
  (**(code **)(*plVar1 + 0x38))(plVar1,local_70,pfVar4);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  view::getCameraPerspectiveMatrix();
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"u_projMatrix",&local_e9);
  pfVar4 = glm::value_ptr<float,(glm::qualifier)0>((mat<4,_4,_float,_(glm::qualifier)0> *)0x349c18);
  (**(code **)(*plVar1 + 0x38))(plVar1,local_e8,pfVar4);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar2 = render::Engine::transparencyEnabled(render::engine);
  plVar1 = local_10;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"u_transparency",&local_111);
    bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    plVar1 = local_10;
    if ((bVar3 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"u_transparency",&local_139);
      in_stack_fffffffffffffb10 =
           (SlicePlane *)PersistentValue<float>::get((PersistentValue<float> *)(in_RDI + 0xb0));
      (**(code **)(*plVar1 + 0x28))(*(float *)&in_stack_fffffffffffffb10->name,plVar1,local_138);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    in_stack_fffffffffffffb08 = (ShaderProgram *)local_161;
    in_stack_fffffffffffffb00 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_161 + 1),"u_viewportDim",(allocator *)in_stack_fffffffffffffb08);
    bVar3 = (**(code **)(*in_stack_fffffffffffffb00 + 0x10))
                      (in_stack_fffffffffffffb00,local_161 + 1);
    std::__cxx11::string::~string((string *)(local_161 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_161);
    if ((bVar3 & 1) != 0) {
      auVar9 = extraout_var;
      auVar12 = extraout_var_01;
      vVar13 = render::Engine::getCurrentViewport(render::engine);
      auVar10._0_8_ = vVar13._8_8_;
      auVar10._8_56_ = auVar12;
      auVar7._0_8_ = vVar13._0_8_;
      auVar7._8_56_ = auVar9;
      local_174._0_8_ = vmovlpd_avx(auVar7._0_16_);
      local_174._8_8_ = vmovlpd_avx(auVar10._0_16_);
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](&local_174,2);
      _x = *pfVar4;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](&local_174,3);
      glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_17c,_x,*pfVar4);
      plVar1 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"u_viewportDim",&local_1a1);
      local_1b0 = local_17c;
      (**(code **)(*plVar1 + 0x40))(local_17c,plVar1,local_1a0);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    }
    bVar2 = render::Engine::transparencyEnabled(render::engine);
    plVar1 = local_10;
    local_1d2 = 0;
    local_1d3 = 0;
    local_1fa = 0;
    local_1fb = 0;
    local_529 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_1d2 = 1;
      std::__cxx11::string::string(local_1d0,"t_minDepth",&local_1d1);
      local_1d3 = 1;
      bVar3 = (**(code **)(*plVar1 + 0xa8))(plVar1,local_1d0);
      plVar1 = local_10;
      local_529 = 0;
      if ((bVar3 & 1) != 0) {
        std::allocator<char>::allocator();
        local_1fa = 1;
        std::__cxx11::string::string(local_1f8,"t_minDepth",&local_1f9);
        local_1fb = 1;
        local_529 = (**(code **)(*plVar1 + 0xb0))(plVar1,local_1f8);
        local_529 = local_529 ^ 0xff;
      }
    }
    if ((local_1fb & 1) != 0) {
      std::__cxx11::string::~string(local_1f8);
    }
    if ((local_1fa & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    }
    if ((local_1d3 & 1) != 0) {
      std::__cxx11::string::~string(local_1d0);
    }
    if ((local_1d2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    }
    plVar1 = local_10;
    if ((local_529 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"t_minDepth",&local_221);
      peVar5 = std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(render::engine->sceneDepthMin).
                           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                         );
      (**(code **)(*plVar1 + 0xd0))(plVar1,local_220,peVar5);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
  }
  local_230 = polyscope::state::slicePlanes;
  local_238._M_current =
       (SlicePlane **)
       std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::begin
                 (in_stack_fffffffffffff9e8);
  local_240 = (SlicePlane **)
              std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::end
                        (in_stack_fffffffffffff9e8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                             *)in_stack_fffffffffffff9f0,
                            (__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                             *)in_stack_fffffffffffff9e8), plVar1 = local_10, bVar2) {
    ppSVar6 = __gnu_cxx::
              __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
              ::operator*(&local_238);
    local_248 = *ppSVar6;
    std::__cxx11::string::string(local_270,(string *)local_248);
    bVar2 = getIgnoreSlicePlane(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_270);
    local_249 = bVar2;
    SlicePlane::setSceneObjectUniforms
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
    __gnu_cxx::
    __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
    ::operator++(&local_238);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"u_viewport_worldPos",&local_291);
  bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_290);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  if ((bVar3 & 1) != 0) {
    auVar9 = extraout_var_00;
    auVar12 = extraout_var_02;
    vVar13 = render::Engine::getCurrentViewport(render::engine);
    plVar1 = local_10;
    auVar11._0_8_ = vVar13._8_8_;
    auVar11._8_56_ = auVar12;
    auVar8._0_8_ = vVar13._0_8_;
    auVar8._8_56_ = auVar9;
    local_2a4 = vmovlpd_avx(auVar8._0_16_);
    uStack_29c = vmovlpd_avx(auVar11._0_16_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"u_viewport_worldPos",&local_2c9);
    local_2e8 = local_2a4;
    uStack_2e0 = uStack_29c;
    (**(code **)(*plVar1 + 0x50))(local_2a4,uStack_29c,plVar1,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  }
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"u_invProjMatrix_worldPos",&local_309);
  bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_308);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  if ((bVar3 & 1) != 0) {
    view::getCameraPerspectiveMatrix();
    glm::inverse<4,4,float,(glm::qualifier)0>(in_stack_fffffffffffff9f0);
    plVar1 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"u_invProjMatrix_worldPos",&local_3b1);
    pfVar4 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x34a865);
    (**(code **)(*plVar1 + 0x38))(plVar1,local_3b0,pfVar4);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  }
  plVar1 = local_10;
  paVar14 = &local_3d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"u_invViewMatrix_worldPos",paVar14);
  bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_3d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  if ((bVar3 & 1) != 0) {
    m = &local_41c;
    view::getCameraViewMatrix();
    glm::inverse<4,4,float,(glm::qualifier)0>(m);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"u_invViewMatrix_worldPos",&local_481);
    pfVar4 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x34aa22);
    (**(code **)(*local_10 + 0x38))(local_10,local_480,pfVar4);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  return;
}

Assistant:

void Structure::setTransformUniforms(render::ShaderProgram& p) {
  glm::mat4 viewMat = getModelView();
  p.setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  p.setUniform("u_projMatrix", glm::value_ptr(projMat));

  if (render::engine->transparencyEnabled()) {
    if (p.hasUniform("u_transparency")) {
      p.setUniform("u_transparency", transparency.get());
    }

    if (p.hasUniform("u_viewportDim")) {
      glm::vec4 viewport = render::engine->getCurrentViewport();
      glm::vec2 viewportDim{viewport[2], viewport[3]};
      p.setUniform("u_viewportDim", viewportDim);
    }

    // Attach the min depth texture, if needed
    // (note that this design is somewhat lazy wrt to the name of the function: it sets a texture, not a uniform, and
    // only actually does anything once on initialization)
    if (render::engine->transparencyEnabled() && p.hasTexture("t_minDepth") && !p.textureIsSet("t_minDepth")) {
      p.setTextureFromBuffer("t_minDepth", render::engine->sceneDepthMin.get());
    }
  }

  // Respect any slice planes
  for (SlicePlane* s : state::slicePlanes) {
    bool ignoreThisPlane = getIgnoreSlicePlane(s->name);
    s->setSceneObjectUniforms(p, ignoreThisPlane);
  }

  // TODO this chain if "if"s is not great. Set up some system in the render engine to conditionally set these? Maybe
  // a list of lambdas? Ugh.
  if (p.hasUniform("u_viewport_worldPos")) {
    glm::vec4 viewport = render::engine->getCurrentViewport();
    p.setUniform("u_viewport_worldPos", viewport);
  }
  if (p.hasUniform("u_invProjMatrix_worldPos")) {
    glm::mat4 P = view::getCameraPerspectiveMatrix();
    glm::mat4 Pinv = glm::inverse(P);
    p.setUniform("u_invProjMatrix_worldPos", glm::value_ptr(Pinv));
  }
  if (p.hasUniform("u_invViewMatrix_worldPos")) {
    glm::mat4 V = view::getCameraViewMatrix();
    glm::mat4 Vinv = glm::inverse(V);
    p.setUniform("u_invViewMatrix_worldPos", glm::value_ptr(Vinv));
  }
}